

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O0

char * __thiscall Potassco::ProgramOptions::Value::desc(Value *this,DescType t)

{
  char *local_28;
  DescType t_local;
  Value *this_local;
  char *local_8;
  
  if ((this->descFlag_ == t) || (this->descFlag_ == '\b')) {
    if (this->descFlag_ == t) {
      local_28 = (this->desc_).value;
    }
    else {
      local_28 = *(char **)((this->desc_).value + (long)((int)t >> 1) * 8);
    }
    local_8 = local_28;
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char* Value::desc(DescType t) const {
	if (descFlag_ == t || descFlag_ == desc_pack) {
		return descFlag_ == t
			? desc_.value
			: desc_.pack[t >> 1u];
	}
	return 0;
}